

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.h
# Opt level: O3

void __thiscall vpl::Scope::Finish(Scope *this)

{
  ostream *poVar1;
  pointer pNVar2;
  pointer pNVar3;
  ulong uVar4;
  __node_base _Var5;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>_>_>
  local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_68._M_buckets._0_1_ = 0x23;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this->out_,(char *)&local_68,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"void vpl::Scope::Finish()",0x19);
  local_68._M_buckets = (__buckets_ptr)CONCAT71(local_68._M_buckets._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_68,1);
  pNVar2 = (this->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pNVar3 = (this->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pNVar3 != pNVar2) {
    uVar4 = 0;
    do {
      local_70._M_h = (__hashtable_alloc *)&local_68;
      if (pNVar2[uVar4].is_global_ == true) {
        local_68._M_buckets = (__buckets_ptr)0x0;
        local_68._M_bucket_count = pNVar2[uVar4].offsets_._M_h._M_bucket_count;
        local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_68._M_element_count = pNVar2[uVar4].offsets_._M_h._M_element_count;
        local_68._M_rehash_policy._M_max_load_factor =
             pNVar2[uVar4].offsets_._M_h._M_rehash_policy._M_max_load_factor;
        local_68._M_rehash_policy._4_4_ =
             *(undefined4 *)&pNVar2[uVar4].offsets_._M_h._M_rehash_policy.field_0x4;
        local_68._M_rehash_policy._M_next_resize =
             pNVar2[uVar4].offsets_._M_h._M_rehash_policy._M_next_resize;
        local_68._M_single_bucket = (__node_base_ptr)0x0;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,int>,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_70._M_h,&pNVar2[uVar4].offsets_._M_h,&local_70);
        for (_Var5._M_nxt = local_68._M_before_begin._M_nxt; _Var5._M_nxt != (_Hash_node_base *)0x0;
            _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
          poVar1 = this->out_;
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    var ",8);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar1,(char *)_Var5._M_nxt[1]._M_nxt,(long)_Var5._M_nxt[2]._M_nxt);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," 1\n",3);
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_68);
        pNVar2 = (this->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pNVar3 = (this->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)(((long)pNVar3 - (long)pNVar2 >> 3) * -0x71c71c71c71c71c7));
  }
  return;
}

Assistant:

void Finish() {
        LOG
        for (size_t i = 0; i < scopes_.size(); ++i) {
            if (scopes_[i].IsGlobal()) {
                for (const auto& [name, offset] : scopes_[i].GetOffsets()) {
                    out_ << "    var " << name << " 1\n";
                }
            }
        }
    }